

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetCompilePDBName
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  char *__rhs;
  allocator local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  allocator local_131;
  string local_130;
  char *local_110;
  char *name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  char *local_e0;
  char *config_name;
  undefined1 local_d0 [8];
  string configProp;
  string configUpper;
  undefined1 local_80 [8];
  string suffix;
  string base;
  string prefix;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  std::__cxx11::string::string((string *)(base.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(suffix.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_80);
  GetFullNameInternal(this,config,RuntimeBinaryArtifact,(string *)(base.field_2._M_local_buf + 8),
                      (string *)(suffix.field_2._M_local_buf + 8),(string *)local_80);
  cmsys::SystemTools::UpperCase((string *)((long)&configProp.field_2 + 8),config);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_d0,"COMPILE_PDB_NAME_",(allocator *)((long)&config_name + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&config_name + 7));
  std::__cxx11::string::operator+=
            ((string *)local_d0,(string *)(configProp.field_2._M_local_buf + 8));
  local_e0 = GetProperty(this,(string *)local_d0);
  if ((local_e0 == (char *)0x0) || (*local_e0 == '\0')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_130,"COMPILE_PDB_NAME",&local_131);
    __rhs = GetProperty(this,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    local_110 = __rhs;
    if ((__rhs == (char *)0x0) || (*__rhs == '\0')) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_159);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
    }
    else {
      std::operator+(&local_158,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&base.field_2 + 8),__rhs);
      std::operator+(__return_storage_ptr__,&local_158,".pdb");
      std::__cxx11::string::~string((string *)&local_158);
    }
  }
  else {
    std::operator+(&local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&base.field_2 + 8),local_e0);
    std::operator+(__return_storage_ptr__,&local_100,".pdb");
    std::__cxx11::string::~string((string *)&local_100);
  }
  name._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)(configProp.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(base.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetCompilePDBName(
  const std::string& config) const
{
  std::string prefix;
  std::string base;
  std::string suffix;
  this->GetFullNameInternal(config, cmStateEnums::RuntimeBinaryArtifact,
                            prefix, base, suffix);

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(config);
  std::string configProp = "COMPILE_PDB_NAME_";
  configProp += configUpper;
  const char* config_name = this->GetProperty(configProp);
  if (config_name && *config_name) {
    return prefix + config_name + ".pdb";
  }

  const char* name = this->GetProperty("COMPILE_PDB_NAME");
  if (name && *name) {
    return prefix + name + ".pdb";
  }

  return "";
}